

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  iterator iVar4;
  PolicyID id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  string_view value;
  bool system;
  string var;
  string foundVar;
  string debugBuffer;
  string mfile;
  string moduleFileName;
  bool local_129;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_t local_78;
  pointer local_70;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  string local_48;
  
  local_70 = (this->Name)._M_dataplus._M_p;
  local_78 = (this->Name)._M_string_length;
  local_88._M_len = 4;
  local_88._M_str = "Find";
  local_68 = 6;
  local_60 = ".cmake";
  views._M_len = 3;
  views._M_array = &local_88;
  cmCatViews_abi_cxx11_(&local_a8,views);
  local_129 = false;
  local_88._M_len = 0x30;
  local_88._M_str = "find_package considered the following paths for ";
  local_78 = local_a8._M_string_length;
  local_70 = local_a8._M_dataplus._M_p;
  local_68 = 2;
  local_60 = ":\n";
  views_00._M_len = 3;
  views_00._M_array = &local_88;
  cmCatViews_abi_cxx11_(&local_e8,views_00);
  cmMakefile::GetModulesFile
            (&local_c8,(this->super_cmFindCommon).Makefile,&local_a8,&local_129,
             (this->super_cmFindCommon).DebugMode,&local_e8);
  if ((this->super_cmFindCommon).DebugMode == true) {
    if (local_c8._M_string_length == 0) {
      local_88._M_len = local_e8._M_string_length;
      local_88._M_str = local_e8._M_dataplus._M_p;
      local_78 = 0x18;
      local_70 = "The file was not found.\n";
      views_02._M_len = 2;
      views_02._M_array = &local_88;
      cmCatViews_abi_cxx11_(&local_128,views_02);
    }
    else {
      local_88._M_len = local_e8._M_string_length;
      local_88._M_str = local_e8._M_dataplus._M_p;
      local_78 = 0x18;
      local_70 = "The file was found at\n  ";
      local_68 = local_c8._M_string_length;
      local_60 = local_c8._M_dataplus._M_p;
      local_58 = 1;
      local_50 = "\n";
      views_01._M_len = 4;
      views_01._M_array = &local_88;
      cmCatViews_abi_cxx11_(&local_128,views_01);
    }
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_88._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_88._M_len = (this->DebugBuffer)._M_string_length;
    local_78 = local_e8._M_string_length;
    local_70 = local_e8._M_dataplus._M_p;
    views_03._M_len = 2;
    views_03._M_array = &local_88;
    cmCatViews_abi_cxx11_(&local_128,views_03);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = true;
  if (local_c8._M_string_length != 0) {
    if (local_129 == true) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::find(&(this->DeprecatedFindModules)._M_t,&this->Name);
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->DeprecatedFindModules)._M_t._M_impl.super__Rb_tree_header) {
        PVar3 = cmMakefile::GetPolicyStatus
                          ((this->super_cmFindCommon).Makefile,iVar4._M_node[2]._M_color,false);
        if (PVar3 - NEW < 3) goto LAB_0026dd7d;
        if (PVar3 == WARN) {
          this_00 = (this->super_cmFindCommon).Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    (&local_108,(cmPolicies *)(ulong)iVar4._M_node[2]._M_color,id);
          local_88._M_len = local_108._M_string_length;
          local_88._M_str = local_108._M_dataplus._M_p;
          local_78 = 1;
          local_70 = "\n";
          views_04._M_len = 2;
          views_04._M_array = &local_88;
          cmCatViews_abi_cxx11_(&local_128,views_04);
          cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    *found = true;
    local_88._M_str = (this->Name)._M_dataplus._M_p;
    local_88._M_len = (this->Name)._M_string_length;
    local_78 = 0xc;
    local_70 = "_FIND_MODULE";
    views_05._M_len = 2;
    views_05._M_array = &local_88;
    cmCatViews_abi_cxx11_(&local_128,views_05);
    value._M_str = "1";
    value._M_len = 1;
    cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,&local_128,value);
    bVar1 = ReadListFile(this,&local_c8,DoPolicyScope);
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,&local_128);
    if ((this->super_cmFindCommon).DebugMode == true) {
      local_88._M_str = (this->Name)._M_dataplus._M_p;
      local_88._M_len = (this->Name)._M_string_length;
      local_78 = 6;
      local_70 = "_FOUND";
      views_06._M_len = 2;
      views_06._M_array = &local_88;
      cmCatViews_abi_cxx11_(&local_108,views_06);
      bVar2 = cmMakefile::IsDefinitionSet((this->super_cmFindCommon).Makefile,&local_108);
      if (bVar2) {
        bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,&local_108);
        if (!bVar2) {
          local_88._M_str = (this->DebugBuffer)._M_dataplus._M_p;
          local_88._M_len = (this->DebugBuffer)._M_string_length;
          local_78 = 0x2a;
          local_70 = "The module is considered not found due to ";
          local_68 = local_108._M_string_length;
          local_60 = local_108._M_dataplus._M_p;
          local_58 = 0xd;
          local_50 = " being FALSE.";
          views_07._M_len = 4;
          views_07._M_array = &local_88;
          cmCatViews_abi_cxx11_(&local_48,views_07);
          std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0026dd7d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string moduleFileName = cmStrCat("Find", this->Name, ".cmake");

  bool system = false;
  std::string debugBuffer = cmStrCat(
    "find_package considered the following paths for ", moduleFileName, ":\n");
  std::string mfile = this->Makefile->GetModulesFile(
    moduleFileName, system, this->DebugMode, debugBuffer);
  if (this->DebugMode) {
    if (mfile.empty()) {
      debugBuffer = cmStrCat(debugBuffer, "The file was not found.\n");
    } else {
      debugBuffer =
        cmStrCat(debugBuffer, "The file was found at\n  ", mfile, "\n");
    }
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }

  if (!mfile.empty()) {
    if (system) {
      auto const it = this->DeprecatedFindModules.find(this->Name);
      if (it != this->DeprecatedFindModules.end()) {
        cmPolicies::PolicyStatus status =
          this->Makefile->GetPolicyStatus(it->second);
        switch (status) {
          case cmPolicies::WARN: {
            this->Makefile->IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(it->second), "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            return true;
        }
      }
    }

    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string const var = cmStrCat(this->Name, "_FIND_MODULE");
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile, DoPolicyScope);
    this->Makefile->RemoveDefinition(var);

    if (this->DebugMode) {
      std::string const foundVar = cmStrCat(this->Name, "_FOUND");
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {

        this->DebugBuffer = cmStrCat(
          this->DebugBuffer, "The module is considered not found due to ",
          foundVar, " being FALSE.");
      }
    }
    return result;
  }
  return true;
}